

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  JBLOCKROW block;
  int Al;
  int blkn;
  int temp;
  huff_entropy_ptr entropy;
  int in_stack_ffffffffffffffcc;
  huff_entropy_ptr in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  uint code;
  int iVar2;
  
  lVar1 = *(long *)(in_RDI + 0x230);
  code = *(uint *)(in_RDI + 0x1d8);
  *(undefined8 *)(lVar1 + 200) = **(undefined8 **)(in_RDI + 0x28);
  *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8);
  if ((*(int *)(in_RDI + 0x13c) != 0) && (*(int *)(lVar1 + 0x38) == 0)) {
    emit_restart_e(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x1a0); iVar2 = iVar2 + 1) {
    emit_bits_e((huff_entropy_ptr)CONCAT44((int)**(short **)(in_RSI + (long)iVar2 * 8),iVar2),code,
                in_stack_ffffffffffffffd8);
  }
  **(undefined8 **)(in_RDI + 0x28) = *(undefined8 *)(lVar1 + 200);
  *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8) = *(undefined8 *)(lVar1 + 0xd0);
  if (*(int *)(in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar1 + 0x38) == 0) {
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)(in_RDI + 0x13c);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
      *(uint *)(lVar1 + 0x3c) = *(uint *)(lVar1 + 0x3c) & 7;
    }
    *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp;
  int blkn;
  int Al = cinfo->Al;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];

    /* We simply emit the Al'th bit of the DC coefficient value. */
    temp = (*block)[0];
    emit_bits_e(entropy, (unsigned int) (temp >> Al), 1);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}